

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O0

_List_iterator<Diligent::Parsing::HLSLTokenInfo>
Diligent::Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
          (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *Start,
          _List_iterator<Diligent::Parsing::HLSLTokenInfo> *End,
          _List_iterator<Diligent::Parsing::HLSLTokenInfo> Pos)

{
  bool bVar1;
  TokenType TVar2;
  int iVar3;
  pointer pHVar4;
  Char *Message;
  undefined1 local_80 [8];
  anon_class_24_3_5ed64ae7 UpdateBracketCount;
  int BracketCount;
  undefined1 local_58 [8];
  string msg;
  int local_30;
  TokenType TStack_2c;
  bool SearchForward;
  HLSLTokenType ClosingBracketType;
  TokenType OpenBracketType;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> *End_local;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> *Start_local;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> Pos_local;
  
  _ClosingBracketType = End;
  End_local = Start;
  Start_local = (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)Pos._M_node;
  bVar1 = std::operator==((_Self *)&Start_local,End);
  if (bVar1) {
    Pos_local._M_node = (_List_node_base *)Start_local;
  }
  else {
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                       ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&Start_local);
    TStack_2c = HLSLTokenInfo::GetType(pHVar4);
    local_30 = 0;
    msg.field_2._M_local_buf[0xf] = '\x01';
    switch(TStack_2c) {
    case OpenBrace:
      local_30 = 0x134;
      break;
    case ClosingBrace:
      local_30 = 0x133;
      msg.field_2._M_local_buf[0xf] = '\0';
      break;
    case OpenParen:
      local_30 = 0x136;
      break;
    case ClosingParen:
      local_30 = 0x135;
      msg.field_2._M_local_buf[0xf] = '\0';
      break;
    case OpenSquareBracket:
      local_30 = 0x138;
      break;
    case ClosingSquareBracket:
      local_30 = 0x137;
      msg.field_2._M_local_buf[0xf] = '\0';
      break;
    case OpenAngleBracket:
      local_30 = 0x13a;
      break;
    case ClosingAngleBracket:
      local_30 = 0x139;
      msg.field_2._M_local_buf[0xf] = '\0';
      break;
    default:
      FormatString<char[37]>
                ((string *)local_58,(char (*) [37])"One of the bracket types is expected");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"FindMatchingBracket",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                 ,0x3c5);
      std::__cxx11::string::~string((string *)local_58);
      return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)
             (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)Start_local;
    }
    if (msg.field_2._M_local_buf[0xf] == '\0') {
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator--
                ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&Start_local);
    }
    else {
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
                ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&Start_local);
    }
    UpdateBracketCount.ClosingBracketType._0_4_ = 1;
    local_80 = (undefined1  [8])&stack0xffffffffffffffd4;
    UpdateBracketCount.OpenBracketType = (TokenType *)&UpdateBracketCount.ClosingBracketType;
    UpdateBracketCount.BracketCount = &local_30;
    if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
      while (bVar1 = std::operator!=((_Self *)&Start_local,End_local), bVar1) {
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                           ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&Start_local);
        TVar2 = HLSLTokenInfo::GetType(pHVar4);
        iVar3 = FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>::
                anon_class_24_3_5ed64ae7::operator()((anon_class_24_3_5ed64ae7 *)local_80,TVar2);
        if (iVar3 == 0) {
          return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)
                 (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)Start_local;
        }
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator--
                  ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&Start_local);
      }
    }
    else {
      while (bVar1 = std::operator!=((_Self *)&Start_local,_ClosingBracketType), bVar1) {
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                           ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&Start_local);
        TVar2 = HLSLTokenInfo::GetType(pHVar4);
        iVar3 = FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>::
                anon_class_24_3_5ed64ae7::operator()((anon_class_24_3_5ed64ae7 *)local_80,TVar2);
        if (iVar3 == 0) {
          return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)
                 (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)Start_local;
        }
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
                  ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&Start_local);
      }
    }
    Pos_local._M_node = _ClosingBracketType->_M_node;
  }
  return (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)Pos_local._M_node;
}

Assistant:

TokenIterType FindMatchingBracket(const TokenIterType& Start,
                                  const TokenIterType& End,
                                  TokenIterType        Pos)
{
    if (Pos == End)
        return Pos;

    const auto OpenBracketType = Pos->GetType();
    using TokenType            = decltype(OpenBracketType);

    auto ClosingBracketType = TokenType::Undefined;
    bool SearchForward      = true;
    switch (OpenBracketType)
    {
        case TokenType::OpenBrace:
            ClosingBracketType = TokenType::ClosingBrace;
            break;

        case TokenType::OpenParen:
            ClosingBracketType = TokenType::ClosingParen;
            break;

        case TokenType::OpenSquareBracket:
            ClosingBracketType = TokenType::ClosingSquareBracket;
            break;

        case TokenType::OpenAngleBracket:
            ClosingBracketType = TokenType::ClosingAngleBracket;
            break;

        case TokenType::ClosingBrace:
            ClosingBracketType = TokenType::OpenBrace;
            SearchForward      = false;
            break;

        case TokenType::ClosingParen:
            ClosingBracketType = TokenType::OpenParen;
            SearchForward      = false;
            break;

        case TokenType::ClosingSquareBracket:
            ClosingBracketType = TokenType::OpenSquareBracket;
            SearchForward      = false;
            break;

        case TokenType::ClosingAngleBracket:
            ClosingBracketType = TokenType::OpenAngleBracket;
            SearchForward      = false;
            break;

        default:
            UNEXPECTED("One of the bracket types is expected");
            return Pos;
    }

    (SearchForward ? ++Pos : --Pos); // Skip open bracket
    int BracketCount = 1;

    auto UpdateBracketCount = [&](TokenType Type) //
    {
        if (Type == OpenBracketType)
            ++BracketCount;
        else if (Type == ClosingBracketType)
        {
            --BracketCount;
        }
        return BracketCount;
    };
    if (SearchForward)
    {
        while (Pos != End)
        {
            if (UpdateBracketCount(Pos->GetType()) == 0)
                return Pos;
            ++Pos;
        }
    }
    else
    {
        while (Pos != Start)
        {
            if (UpdateBracketCount(Pos->GetType()) == 0)
                return Pos;
            --Pos;
        }
    }
    return End;
}